

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O0

void check_cb(uv_check_t *handle)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_check_t *handle_local;
  
  if (handle != &check_handle) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x3d,"&check_handle","==","handle",&check_handle,"==",handle);
    abort();
  }
  if ((long)recv_cnt != 6) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x44,"5+1","==","recv_cnt",6,"==",(long)recv_cnt);
    abort();
  }
  check_cb_called = 1;
  iVar1 = uv_check_stop(&check_handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
            ,0x48,"uv_check_stop(handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&server,(uv_close_cb)0x0);
  return;
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT_EQ(0, check_cb_called);
  ASSERT_EQ(0, timer_cb_called);
  ASSERT_EQ(0, close_cb_called);
  uv_close((uv_handle_t*) handle, close_cb);
  uv_close((uv_handle_t*) &timer_handle2, close_cb);
  check_cb_called++;
}